

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

DWORD __thiscall TSparseArray::GetItem1(TSparseArray *this,DWORD index)

{
  TGenericArray<_BASEVALS> *this_00;
  ulong uVar1;
  undefined8 uVar2;
  DWORD DVar3;
  SETBITS SVar4;
  _BASEVALS *p_Var5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong index_00;
  uint uVar10;
  bool bVar11;
  
  if ((index & 0x1ff) == 0) {
    puVar6 = TGenericArray<unsigned_int>::operator[](&this->IndexToItem1,(ulong)(index >> 9));
    DVar3 = *puVar6;
  }
  else {
    DVar3 = FindGroup_Items1(this,index);
    this_00 = &this->BaseVals;
    index_00 = (ulong)DVar3;
    p_Var5 = TGenericArray<_BASEVALS>::operator[](this_00,index_00);
    uVar10 = index - p_Var5->BaseValue200;
    uVar9 = DVar3 << 4;
    p_Var5 = TGenericArray<_BASEVALS>::operator[](this_00,index_00);
    uVar7 = *(uint *)&p_Var5->field_0x4;
    p_Var5 = TGenericArray<_BASEVALS>::operator[](this_00,index_00);
    uVar1 = *(ulong *)&p_Var5->field_0x4;
    p_Var5 = TGenericArray<_BASEVALS>::operator[](this_00,index_00);
    uVar2 = *(undefined8 *)&p_Var5->field_0x4;
    if (uVar10 < uVar7 >> 0x17) {
      uVar7 = (uint)uVar2;
      if (uVar10 < ((uint)(uVar1 >> 7) & 0xff)) {
        if ((uVar7 & 0x7f) <= uVar10) {
          p_Var5 = TGenericArray<_BASEVALS>::operator[](this_00,index_00);
          uVar10 = uVar10 - (*(uint *)&p_Var5->field_0x4 & 0x7f);
          uVar9 = uVar9 | 2;
        }
      }
      else {
        p_Var5 = TGenericArray<_BASEVALS>::operator[](this_00,index_00);
        if (uVar10 < (uVar7 >> 0xf & 0xff)) {
          uVar10 = uVar10 - (*(uint *)&p_Var5->field_0x4 >> 7 & 0xff);
          uVar9 = uVar9 | 4;
        }
        else {
          uVar10 = uVar10 - (*(uint *)&p_Var5->field_0x4 >> 0xf & 0xff);
          uVar9 = uVar9 | 6;
        }
      }
    }
    else {
      p_Var5 = TGenericArray<_BASEVALS>::operator[](this_00,index_00);
      uVar8 = (uint)((ulong)uVar2 >> 0x20);
      uVar7 = (uint)(*(ulong *)&p_Var5->field_0x4 >> 0x20);
      if (uVar10 < ((uint)(uVar1 >> 0x29) & 0x1ff)) {
        if (uVar10 < (uVar8 & 0x1ff)) {
          uVar10 = uVar10 - ((uint)(*(ulong *)&p_Var5->field_0x4 >> 0x17) & 0x1ff);
          uVar9 = uVar9 | 8;
        }
        else {
          uVar10 = uVar10 - (uVar7 & 0x1ff);
          uVar9 = uVar9 | 10;
        }
      }
      else if (uVar10 < (uVar8 >> 0x12 & 0x1ff)) {
        uVar10 = uVar10 - (uVar7 >> 9 & 0x1ff);
        uVar9 = uVar9 | 0xc;
      }
      else {
        uVar10 = uVar10 - (uVar7 >> 0x12 & 0x1ff);
        uVar9 = uVar9 | 0xe;
      }
    }
    puVar6 = TGenericArray<unsigned_int>::operator[](&this->ItemBits,(ulong)uVar9);
    DVar3 = *puVar6;
    SVar4 = GetNumberOfSetBits(DVar3);
    uVar7 = SVar4.SetBitsAll >> 0x18;
    if (uVar7 <= uVar10) {
      uVar9 = uVar9 + 1;
      puVar6 = TGenericArray<unsigned_int>::operator[](&this->ItemBits,(ulong)uVar9);
      DVar3 = *puVar6;
      SVar4 = GetNumberOfSetBits(DVar3);
      uVar10 = uVar10 - uVar7;
    }
    uVar9 = uVar9 << 5;
    uVar8 = SVar4.SetBitsAll >> 8 & 0xff;
    uVar7 = uVar10 - uVar8;
    if (uVar10 < uVar8) {
      if ((SVar4.SetBitsAll & 0xff) <= uVar10) {
        uVar9 = uVar9 | 8;
        DVar3 = DVar3 >> 8;
        uVar10 = uVar10 - (SVar4.SetBitsAll & 0xff);
      }
    }
    else {
      uVar8 = SVar4.SetBitsAll >> 0x10 & 0xff;
      bVar11 = uVar10 < uVar8;
      uVar10 = uVar10 - uVar8;
      if (bVar11) {
        DVar3 = DVar3 >> 0x10;
        uVar9 = uVar9 | 0x10;
        uVar10 = uVar7;
      }
      else {
        DVar3 = DVar3 >> 0x18;
        uVar9 = uVar9 | 0x18;
      }
    }
    if (0x7ff < uVar10 << 8) {
      __assert_fail("(bitGroup + distFromBase) < sizeof(table_1BA1818)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                    ,0x498,"DWORD TSparseArray::GetItem1(DWORD)");
    }
    DVar3 = uVar9 + table_1BA1818[DVar3 & 0xff | uVar10 << 8];
  }
  return DVar3;
}

Assistant:

DWORD GetItem1(DWORD index)
    {
        SETBITS setBits;
        DWORD distFromBase;
        DWORD groupIndex;
        DWORD dwordIndex;
        DWORD itemIndex;
        DWORD bitGroup;

        // If the index is at begin of the group, we just return the start value
        if ((index & 0x1FF) == 0)
            return IndexToItem1[INDEX_TO_GROUP(index)];

        // Find the group where the index belongs to
        groupIndex = FindGroup_Items1(index);

        // Calculate the base200 dword index (HOTS: 1959FD4)
        distFromBase = index - BaseVals[groupIndex].BaseValue200;
        dwordIndex = groupIndex << 0x04;

        // Calculate the dword index including the sub-checkpoint
        if (distFromBase < BaseVals[groupIndex].AddValue100)
        {
            // HOTS: 1959FF1
            if (distFromBase < BaseVals[groupIndex].AddValue80)
            {
                // HOTS: 0195A000
                if (distFromBase >= BaseVals[groupIndex].AddValue40)
                {
                    // HOTS: 195A007
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue40;
                    dwordIndex += 2;
                }
            }
            else
            {
                // HOTS: 195A00E
                if (distFromBase < BaseVals[groupIndex].AddValueC0)
                {
                    // HOTS: 195A01A
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue80;
                    dwordIndex += 4;
                }
                else
                {
                    // HOTS: 195A01F
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValueC0;
                    dwordIndex += 6;
                }
            }
        }
        else
        {
            // HOTS: 195A026
            if (distFromBase < BaseVals[groupIndex].AddValue180)
            {
                // HOTS: 195A037
                if (distFromBase < BaseVals[groupIndex].AddValue140)
                {
                    // HOTS: 195A041
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue100;
                    dwordIndex += 8;
                }
                else
                {
                    // HOTS: 195A048
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue140;
                    dwordIndex += 10;
                }
            }
            else
            {
                // HOTS: 195A04D
                if (distFromBase < BaseVals[groupIndex].AddValue1C0)
                {
                    // HOTS: 195A05A
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue180;
                    dwordIndex += 12;
                }
                else
                {
                    // HOTS: 195A061
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue1C0;
                    dwordIndex += 14;
                }
            }
        }

        // HOTS: 195A066
        bitGroup = ItemBits[dwordIndex];
        setBits = GetNumberOfSetBits(bitGroup);

        // Get total number of set bits in the bit group
        if (distFromBase >= setBits.u.Lower32)
        {
            // HOTS: 195A0B2
            bitGroup = ItemBits[++dwordIndex];
            distFromBase = distFromBase - setBits.u.Lower32;
            setBits = GetNumberOfSetBits(bitGroup);
        }

        // Calculate the item index
        itemIndex = (dwordIndex << 0x05);

        // Get the number of set bits in the lower word (HOTS: 195A0F6)
        if (distFromBase < setBits.u.Lower16)
        {
            // HOTS: 195A111
            if (distFromBase >= setBits.u.Lower08)
            {
                // HOTS: 195A111
                itemIndex = itemIndex + 0x08;
                bitGroup = bitGroup >> 0x08;
                distFromBase = distFromBase - setBits.u.Lower08;
            }
        }
        else
        {
            // HOTS: 195A119
            if (distFromBase < setBits.u.Lower24)
            {
                // HOTS: 195A125
                bitGroup = bitGroup >> 0x10;
                itemIndex = itemIndex + 0x10;
                distFromBase = distFromBase - setBits.u.Lower16;
            }
            else
            {
                // HOTS: 195A12F
                bitGroup = bitGroup >> 0x18;
                itemIndex = itemIndex + 0x18;
                distFromBase = distFromBase - setBits.u.Lower24;
            }
        }

        bitGroup = bitGroup & 0xFF;
        distFromBase = distFromBase << 0x08;

        // BUGBUG: Potential buffer overflow
        // Happens in Heroes of the Storm when index == 0x5B
        assert((bitGroup + distFromBase) < sizeof(table_1BA1818));
        return table_1BA1818[bitGroup + distFromBase] + itemIndex;
    }